

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlsave.c
# Opt level: O0

int xmlDocFormatDump(FILE *f,xmlDocPtr cur,int format)

{
  xmlOutputBufferPtr buf_00;
  xmlOutputBufferPtr buf;
  int format_local;
  xmlDocPtr cur_local;
  FILE *f_local;
  
  if (cur == (xmlDocPtr)0x0) {
    f_local._4_4_ = -1;
  }
  else {
    buf_00 = xmlOutputBufferCreateFile(f,(xmlCharEncodingHandlerPtr)0x0);
    if (buf_00 == (xmlOutputBufferPtr)0x0) {
      f_local._4_4_ = -1;
    }
    else {
      xmlDocDumpInternal(buf_00,cur,(char *)0x0,format);
      f_local._4_4_ = xmlOutputBufferClose(buf_00);
    }
  }
  return f_local._4_4_;
}

Assistant:

int
xmlDocFormatDump(FILE *f, xmlDocPtr cur, int format) {
    xmlOutputBufferPtr buf;

    if (cur == NULL) {
	return(-1);
    }

    buf = xmlOutputBufferCreateFile(f, NULL);
    if (buf == NULL) return(-1);

    xmlDocDumpInternal(buf, cur, NULL, format);

    return(xmlOutputBufferClose(buf));
}